

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O0

Activation * __thiscall
PyreNet::ActivationFactory::generateActivation(ActivationFactory *this,activationType activation)

{
  exception *this_00;
  activationType activation_local;
  ActivationFactory *this_local;
  
  switch(activation) {
  case step:
    this_local = (ActivationFactory *)operator_new(8);
    memset(this_local,0,8);
    Step::Step((Step *)this_local);
    break;
  case linear:
    this_local = (ActivationFactory *)operator_new(8);
    memset(this_local,0,8);
    Linear::Linear((Linear *)this_local);
    break;
  case sigmoid:
    this_local = (ActivationFactory *)operator_new(8);
    memset(this_local,0,8);
    Sigmoid::Sigmoid((Sigmoid *)this_local);
    break;
  case tanh:
    this_local = (ActivationFactory *)operator_new(8);
    memset(this_local,0,8);
    Tanh::Tanh((Tanh *)this_local);
    break;
  case relu:
    this_local = (ActivationFactory *)operator_new(8);
    memset(this_local,0,8);
    Relu::Relu((Relu *)this_local);
    break;
  default:
    this_00 = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(this_00);
    __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
  }
  return (Activation *)this_local;
}

Assistant:

Activation *
    ActivationFactory::generateActivation(LayerDefinition::activationType activation) { // generate dynamic class
        switch (activation) {
            case LayerDefinition::step: {
                return new Step();
            }
            case LayerDefinition::linear: {
                return new Linear();
            }
            case LayerDefinition::tanh: {
                return new Tanh();
            }
            case LayerDefinition::sigmoid: {
                return new Sigmoid();
            }
            case LayerDefinition::relu: {
                return new Relu();
            }
            default: {
                throw std::exception();
            }
        }
    }